

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O3

void ge25519_pack(uchar *r,ge25519 *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  ulong uVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  uchar *puVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  uchar *puVar114;
  undefined1 *puVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  long lVar120;
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  uchar parity [32];
  bignum25519 zi;
  char local_78 [8];
  undefined1 auStack_70 [24];
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  curve25519_recip(&local_58,p->z);
  uVar112 = p->x[0];
  uVar119 = p->x[1];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar112;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_58;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar119;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_58;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar112;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_50;
  uVar124 = p->x[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar124;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_58;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar112;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_48;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar119;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_50;
  uVar121 = p->x[3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar121;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_58;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar112;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_40;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar124;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_50;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar119;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_48;
  uVar116 = p->x[4];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar116;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_58;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar112;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_38;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar119;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_40;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar121;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_50;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar124;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_48;
  uVar125 = local_48 * 0x13;
  uVar122 = local_38 * 0x13;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar119;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar122;
  uVar101 = local_40 * 0x13;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar116;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_50 * 0x13;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar121;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar125;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar124;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar101;
  auVar1 = auVar19 * auVar69 + auVar1 * auVar51 + auVar16 * auVar66 + auVar18 * auVar68 +
           auVar17 * auVar67;
  uVar113 = auVar1._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar124;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar122;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar116;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar125;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar121;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar101;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar121;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar122;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar116;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar101;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar116;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar122;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = auVar1._8_8_ * 0x2000 | uVar113 >> 0x33;
  auVar104 = auVar22 * auVar72 + auVar3 * auVar53 + auVar2 * auVar52 + auVar20 * auVar70 +
             auVar21 * auVar71 + auVar104;
  uVar118 = auVar104._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = auVar104._8_8_ * 0x2000 | uVar118 >> 0x33;
  auVar105 = auVar24 * auVar74 +
             auVar23 * auVar73 + auVar4 * auVar54 + auVar5 * auVar55 + auVar6 * auVar56 + auVar105;
  uVar111 = auVar105._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = auVar105._8_8_ * 0x2000 | uVar111 >> 0x33;
  auVar102 = auVar25 * auVar75 +
             auVar10 * auVar60 + auVar8 * auVar58 + auVar9 * auVar59 + auVar7 * auVar57 + auVar102;
  uVar117 = auVar102._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar102._8_8_ << 0xd | uVar117 >> 0x33;
  auVar108 = auVar11 * auVar61 +
             auVar14 * auVar64 + auVar15 * auVar65 + auVar12 * auVar62 + auVar13 * auVar63 +
             auVar108;
  uVar123 = auVar108._0_8_;
  uVar112 = p->y[0];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar112;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_58;
  uVar119 = p->y[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar119;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_58;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar112;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_50;
  uVar124 = p->y[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar124;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_58;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar112;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_48;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar119;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_50;
  uVar121 = p->y[3];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar121;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_58;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar112;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_40;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar124;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = local_50;
  uVar116 = p->y[4];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar119;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_48;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar116;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = local_58;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar112;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_38;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar119;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_40;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar121;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_50;
  uVar113 = (auVar108._8_8_ * 0x2000 | uVar123 >> 0x33) * 0x13 + (uVar113 & 0x7ffffffffffff);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar124;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_48;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar119;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar122;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar116;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = local_50 * 0x13;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar121;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar125;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar124;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar101;
  auVar1 = auVar42 * auVar92 +
           auVar43 * auVar93 + auVar44 * auVar94 + auVar41 * auVar91 + auVar26 * auVar76;
  uVar119 = auVar1._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar124;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar122;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar116;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar125;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar121;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar101;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar121;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar122;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar116;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar101;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar116;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar122;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = auVar1._8_8_ * 0x2000 | uVar119 >> 0x33;
  auVar109 = auVar46 * auVar96 +
             auVar47 * auVar97 + auVar45 * auVar95 + auVar27 * auVar77 + auVar28 * auVar78 +
             auVar109;
  uVar112 = auVar109._0_8_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = auVar109._8_8_ * 0x2000 | uVar112 >> 0x33;
  auVar106 = auVar49 * auVar99 +
             auVar48 * auVar98 + auVar31 * auVar81 + auVar30 * auVar80 + auVar29 * auVar79 +
             auVar106;
  uVar125 = auVar106._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar106._8_8_ * 0x2000 | uVar125 >> 0x33;
  auVar103 = auVar50 * auVar100 +
             auVar35 * auVar85 + auVar33 * auVar83 + auVar34 * auVar84 + auVar32 * auVar82 +
             auVar103;
  uVar124 = auVar103._0_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = auVar103._8_8_ << 0xd | uVar124 >> 0x33;
  auVar107 = auVar39 * auVar89 + auVar40 * auVar90 + auVar37 * auVar87 + auVar38 * auVar88 +
             auVar36 * auVar86 + auVar107;
  uVar121 = auVar107._0_8_;
  uVar116 = (auVar107._8_8_ * 0x2000 | uVar121 >> 0x33) * 0x13 + (uVar119 & 0x7ffffffffffff);
  uVar112 = (uVar116 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar119 = (uVar112 >> 0x33) + (uVar125 & 0x7ffffffffffff);
  uVar124 = (uVar119 >> 0x33) + (uVar124 & 0x7ffffffffffff);
  uVar121 = (uVar124 >> 0x33) + (uVar121 & 0x7ffffffffffff);
  uVar116 = (uVar121 >> 0x33) * 0x13 + (uVar116 & 0x7ffffffffffff);
  uVar125 = (uVar116 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar112 = (uVar125 >> 0x33) + (uVar119 & 0x7ffffffffffff);
  uVar124 = (uVar112 >> 0x33) + (uVar124 & 0x7ffffffffffff);
  uVar122 = (uVar124 >> 0x33) + (uVar121 & 0x7ffffffffffff);
  uVar119 = (uVar116 & 0x7ffffffffffff) + (uVar122 >> 0x33) * 0x13 + 0x13;
  uVar125 = (uVar119 >> 0x33) + (uVar125 & 0x7ffffffffffff);
  uVar112 = (uVar125 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar121 = (uVar112 >> 0x33) + (uVar124 & 0x7ffffffffffff);
  uVar124 = (uVar121 >> 0x33) + (uVar122 & 0x7ffffffffffff);
  uVar116 = (uVar124 >> 0x33) * 0x13 + (uVar119 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar125 = (uVar125 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar116 >> 0x33);
  uVar119 = (uVar112 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar125 >> 0x33);
  uVar121 = (uVar121 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar119 >> 0x33);
  uVar112 = uVar125 << 0x33 | uVar116 & 0x7ffffffffffff;
  lVar120 = 8;
  puVar110 = r;
  do {
    puVar114 = puVar110;
    *puVar114 = (uchar)uVar112;
    uVar112 = uVar112 >> 8;
    lVar120 = lVar120 + -1;
    puVar110 = puVar114 + 1;
  } while (lVar120 != 0);
  uVar112 = uVar119 << 0x26 | uVar125 >> 0xd & 0x3fffffffff;
  lVar120 = 0;
  do {
    (puVar114 + 1)[lVar120] = (uchar)uVar112;
    lVar120 = lVar120 + 1;
    uVar112 = uVar112 >> 8;
  } while (lVar120 != 8);
  uVar116 = (uVar113 >> 0x33) + (uVar118 & 0x7ffffffffffff);
  uVar112 = uVar121 * 0x2000000 | (ulong)((uint)(uVar119 >> 0x1a) & 0x1ffffff);
  puVar114 = puVar114 + 9;
  lVar120 = 8;
  do {
    *puVar114 = (uchar)uVar112;
    puVar114 = puVar114 + 1;
    uVar112 = uVar112 >> 8;
    lVar120 = lVar120 + -1;
  } while (lVar120 != 0);
  uVar112 = (uVar124 + 0x7ffffffffffff + (uVar121 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
            (ulong)((uint)(uVar121 >> 0x27) & 0xfff);
  lVar120 = 8;
  do {
    *puVar114 = (uchar)uVar112;
    puVar114 = puVar114 + 1;
    uVar112 = uVar112 >> 8;
    lVar120 = lVar120 + -1;
  } while (lVar120 != 0);
  uVar112 = (uVar116 >> 0x33) + (uVar111 & 0x7ffffffffffff);
  uVar119 = (uVar112 >> 0x33) + (uVar117 & 0x7ffffffffffff);
  uVar124 = (uVar119 >> 0x33) + (uVar123 & 0x7ffffffffffff);
  uVar121 = (uVar124 >> 0x33) * 0x13 + (uVar113 & 0x7ffffffffffff);
  uVar116 = (uVar121 >> 0x33) + (uVar116 & 0x7ffffffffffff);
  uVar125 = (uVar116 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar112 = (uVar125 >> 0x33) + (uVar119 & 0x7ffffffffffff);
  uVar122 = (uVar112 >> 0x33) + (uVar124 & 0x7ffffffffffff);
  uVar119 = (uVar121 & 0x7ffffffffffff) + (uVar122 >> 0x33) * 0x13 + 0x13;
  uVar124 = (uVar119 >> 0x33) + (uVar116 & 0x7ffffffffffff);
  uVar121 = (uVar124 >> 0x33) + (uVar125 & 0x7ffffffffffff);
  uVar116 = (uVar121 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar112 = (uVar116 >> 0x33) + (uVar122 & 0x7ffffffffffff);
  uVar122 = (uVar119 & 0x7ffffffffffff) + (uVar112 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar125 = (uVar122 >> 0x33) + (uVar124 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar121 = (uVar125 >> 0x33) + (uVar121 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar119 = (uVar121 >> 0x33) + (uVar116 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar124 = uVar125 << 0x33 | uVar122 & 0x7ffffffffffff;
  lVar120 = 0;
  do {
    local_78[lVar120] = (char)uVar124;
    lVar120 = lVar120 + 1;
    uVar124 = uVar124 >> 8;
  } while (lVar120 != 8);
  puVar115 = auStack_70;
  uVar124 = uVar121 << 0x26 | uVar125 >> 0xd & 0x3fffffffff;
  lVar120 = 8;
  do {
    *puVar115 = (char)uVar124;
    puVar115 = puVar115 + 1;
    uVar124 = uVar124 >> 8;
    lVar120 = lVar120 + -1;
  } while (lVar120 != 0);
  uVar124 = uVar119 * 0x2000000 | (ulong)((uint)(uVar121 >> 0x1a) & 0x1ffffff);
  lVar120 = 8;
  do {
    *puVar115 = (char)uVar124;
    puVar115 = puVar115 + 1;
    uVar124 = uVar124 >> 8;
    lVar120 = lVar120 + -1;
  } while (lVar120 != 0);
  uVar112 = (uVar112 + 0x7ffffffffffff + (uVar119 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
            (ulong)((uint)(uVar119 >> 0x27) & 0xfff);
  lVar120 = 8;
  do {
    *puVar115 = (char)uVar112;
    puVar115 = puVar115 + 1;
    uVar112 = uVar112 >> 8;
    lVar120 = lVar120 + -1;
  } while (lVar120 != 0);
  r[0x1f] = r[0x1f] ^ local_78[0] << 7;
  return;
}

Assistant:

static void
ge25519_pack(unsigned char r[32], const ge25519 *p) {
	bignum25519 tx, ty, zi;
	unsigned char parity[32];
	curve25519_recip(zi, p->z);
	curve25519_mul(tx, p->x, zi);
	curve25519_mul(ty, p->y, zi);
	curve25519_contract(r, ty);
	curve25519_contract(parity, tx);
	r[31] ^= ((parity[0] & 1) << 7);
}